

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.hpp
# Opt level: O1

void __thiscall test::test(test *this,char *functionName)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-------------------------------------------------------------------",0x43);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (functionName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x209458);
  }
  else {
    sVar1 = strlen(functionName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,functionName,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-------------------------------------------------------------------",0x43);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

test(const char *functionName)
    {
        std::cout << "-------------------------------------------------------------------" << std::endl;
        std::cout << functionName << std::endl;
        std::cout << "-------------------------------------------------------------------" << std::endl;
    }